

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68010_rtd(m68k_info *info)

{
  m68k_info *in_RDI;
  m68k_info *unaff_retaddr;
  m68k_info *pmVar1;
  
  set_insn_group(in_RDI,M68K_GRP_RET);
  if ((in_RDI->type & 0x1e) == 0) {
    d68000_invalid((m68k_info *)0x3a16c2);
  }
  else {
    pmVar1 = in_RDI;
    read_imm_16(in_RDI);
    build_absolute_jump_with_immediate
              (unaff_retaddr,(int)((ulong)pmVar1 >> 0x20),(int)pmVar1,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

static void d68010_rtd(m68k_info *info)
{
	set_insn_group(info, M68K_GRP_RET);
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_absolute_jump_with_immediate(info, M68K_INS_RTD, 0, read_imm_16(info));
}